

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  mbedtls_pk_type_t mVar3;
  mbedtls_ecp_curve_info *pmVar4;
  char *pcVar5;
  mbedtls_pk_info_t *info;
  int iVar6;
  char *__s1;
  mbedtls_mpi *X;
  char *pcVar7;
  ulong uVar8;
  char **ppcVar9;
  mbedtls_pk_context key;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char buf [1024];
  mbedtls_pk_context mStack_a68;
  mbedtls_mpi local_a58;
  mbedtls_mpi local_a40;
  mbedtls_mpi local_a28;
  mbedtls_mpi local_a10;
  mbedtls_mpi local_9f8;
  mbedtls_mpi local_9e0;
  mbedtls_mpi local_9c8;
  mbedtls_mpi local_9b0;
  mbedtls_ctr_drbg_context local_998;
  mbedtls_entropy_context local_840;
  char local_438 [1032];
  
  mbedtls_mpi_init(&local_9b0);
  mbedtls_mpi_init(&local_9c8);
  mbedtls_mpi_init(&local_9e0);
  mbedtls_mpi_init(&local_9f8);
  mbedtls_mpi_init(&local_a10);
  mbedtls_mpi_init(&local_a28);
  mbedtls_mpi_init(&local_a40);
  mbedtls_mpi_init(&local_a58);
  mbedtls_pk_init(&mStack_a68);
  mbedtls_ctr_drbg_init(&local_998);
  memset(local_438,0,0x400);
  if (argc == 0) {
LAB_001096dc:
    printf(
          "\n usage: gen_key param=<>...\n\n acceptable parameters:\n    type=rsa|ec           default: rsa\n    rsa_keysize=%%d        default: 4096\n    ec_curve=%%s           see below\n    filename=%%s           default: keyfile.key\n    format=pem|der        default: pem\n    use_dev_random=0|1    default: 0\n\n"
          );
    puts(" available ec_curve values:");
    pmVar4 = mbedtls_ecp_curve_list();
    printf("    %s (default)\n",pmVar4->name);
    iVar1 = 1;
    if (pmVar4[1].name != (char *)0x0) {
      ppcVar9 = &pmVar4[2].name;
      do {
        printf("    %s\n");
        pcVar7 = *ppcVar9;
        ppcVar9 = ppcVar9 + 2;
      } while (pcVar7 != (char *)0x0);
    }
  }
  else {
    opt.type = 1;
    opt.rsa_keysize = 0x1000;
    pmVar4 = mbedtls_ecp_curve_list();
    opt.ec_curve = pmVar4->grp_id;
    opt.filename = "keyfile.key";
    opt.format = 0;
    opt.use_dev_random = 0;
    if (1 < argc) {
      uVar8 = 1;
      do {
        pcVar7 = argv[uVar8];
        pcVar5 = strchr(pcVar7,0x3d);
        if (pcVar5 == (char *)0x0) goto LAB_001096dc;
        __s1 = pcVar5 + 1;
        *pcVar5 = '\0';
        iVar1 = strcmp(pcVar7,"type");
        if (iVar1 == 0) {
          iVar1 = strcmp(__s1,"rsa");
          if (iVar1 == 0) {
            opt.type = 1;
            __s1 = opt.filename;
          }
          else {
            if (((*__s1 != 'e') || (pcVar5[2] != 'c')) || (pcVar5[3] != '\0')) goto LAB_001096dc;
            opt.type = 2;
            __s1 = opt.filename;
          }
        }
        else {
          iVar1 = strcmp(pcVar7,"format");
          if (iVar1 == 0) {
            iVar1 = strcmp(__s1,"pem");
            if (iVar1 == 0) {
              opt._24_8_ = opt._24_8_ & 0xffffffff00000000;
              __s1 = opt.filename;
            }
            else {
              iVar1 = strcmp(__s1,"der");
              if (iVar1 != 0) goto LAB_001096dc;
              opt.format = 1;
              __s1 = opt.filename;
            }
          }
          else {
            iVar1 = strcmp(pcVar7,"rsa_keysize");
            if (iVar1 == 0) {
              iVar1 = atoi(__s1);
              opt.rsa_keysize = iVar1;
              __s1 = opt.filename;
              if (iVar1 - 0x2001U < 0xffffe3ff) goto LAB_001096dc;
            }
            else {
              iVar1 = strcmp(pcVar7,"ec_curve");
              if (iVar1 == 0) {
                pmVar4 = mbedtls_ecp_curve_info_from_name(__s1);
                if (pmVar4 == (mbedtls_ecp_curve_info *)0x0) goto LAB_001096dc;
                opt.ec_curve = pmVar4->grp_id;
                __s1 = opt.filename;
              }
              else {
                iVar1 = strcmp(pcVar7,"filename");
                if (iVar1 != 0) {
                  iVar1 = strcmp(pcVar7,"use_dev_random");
                  if (iVar1 != 0) goto LAB_001096dc;
                  uVar2 = atoi(__s1);
                  opt.use_dev_random = uVar2;
                  __s1 = opt.filename;
                  if (1 < uVar2) goto LAB_001096dc;
                }
              }
            }
          }
        }
        opt.filename = __s1;
        uVar8 = uVar8 + 1;
      } while ((uint)argc != uVar8);
    }
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init(&local_840);
    if (opt.use_dev_random == 0) {
LAB_0010975e:
      iVar1 = mbedtls_ctr_drbg_seed(&local_998,mbedtls_entropy_func,&local_840,(uchar *)"gen_key",7)
      ;
      if (iVar1 == 0) {
        printf("\n  . Generating the private key ...");
        fflush(_stdout);
        info = mbedtls_pk_info_from_type(opt.type);
        iVar1 = mbedtls_pk_setup(&mStack_a68,info);
        if (iVar1 == 0) {
          if (opt.type == 2) {
            iVar1 = mbedtls_ecp_gen_key(opt.ec_curve,(mbedtls_ecp_keypair *)mStack_a68.pk_ctx,
                                        mbedtls_ctr_drbg_random,&local_998);
            if (iVar1 == 0) {
LAB_00109931:
              puts(" ok\n  . Key information:");
              mVar3 = mbedtls_pk_get_type(&mStack_a68);
              if (mVar3 == MBEDTLS_PK_RSA) {
                iVar1 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_a68.pk_ctx,&local_9b0,
                                           &local_9c8,&local_9e0,&local_9f8,&local_a10);
                if ((iVar1 == 0) &&
                   (iVar1 = mbedtls_rsa_export_crt
                                      ((mbedtls_rsa_context *)mStack_a68.pk_ctx,&local_a28,
                                       &local_a40,&local_a58), iVar1 == 0)) {
                  mbedtls_mpi_write_file("N:  ",&local_9b0,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("E:  ",&local_a10,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("D:  ",&local_9f8,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("P:  ",&local_9c8,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("Q:  ",&local_9e0,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("DP: ",&local_a28,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("DQ:  ",&local_a40,0x10,(FILE *)0x0);
                  pcVar7 = "QP:  ";
                  X = &local_a58;
LAB_00109aed:
                  mbedtls_mpi_write_file(pcVar7,X,0x10,(FILE *)0x0);
                  goto LAB_00109af9;
                }
                pcVar7 = " failed\n  ! could not export RSA parameters\n";
              }
              else {
                mVar3 = mbedtls_pk_get_type(&mStack_a68);
                if (mVar3 == MBEDTLS_PK_ECKEY) {
                  pmVar4 = mbedtls_ecp_curve_info_from_grp_id
                                     (((mbedtls_ecp_group *)mStack_a68.pk_ctx)->id);
                  printf("curve: %s\n",pmVar4->name);
                  mbedtls_mpi_write_file
                            ("X_Q:   ",(mbedtls_mpi *)((long)mStack_a68.pk_ctx + 0x110),0x10,
                             (FILE *)0x0);
                  mbedtls_mpi_write_file
                            ("Y_Q:   ",&((mbedtls_ecp_point *)((long)mStack_a68.pk_ctx + 0x110))->Y,
                             0x10,(FILE *)0x0);
                  X = (mbedtls_mpi *)((long)mStack_a68.pk_ctx + 0xf8);
                  pcVar7 = "D:     ";
                  goto LAB_00109aed;
                }
                puts("  ! key type not supported");
LAB_00109af9:
                iVar6 = 0;
                printf("  . Writing key to file...");
                iVar1 = write_private_key(&mStack_a68,opt.filename);
                if (iVar1 == 0) {
                  puts(" ok");
                  goto LAB_0010980f;
                }
                pcVar7 = " failed";
              }
              puts(pcVar7);
              goto LAB_001097e2;
            }
            uVar8 = (ulong)(uint)-iVar1;
            pcVar7 = " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x";
          }
          else {
            if (opt.type != 1) {
              puts(" failed\n  !  key type not supported");
              iVar1 = 0;
              goto LAB_001097e2;
            }
            iVar1 = mbedtls_rsa_gen_key((mbedtls_rsa_context *)mStack_a68.pk_ctx,
                                        mbedtls_ctr_drbg_random,&local_998,opt.rsa_keysize,0x10001);
            if (iVar1 == 0) goto LAB_00109931;
            uVar8 = (ulong)(uint)-iVar1;
            pcVar7 = " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x";
          }
        }
        else {
          uVar8 = (ulong)(uint)-iVar1;
          pcVar7 = " failed\n  !  mbedtls_pk_setup returned -0x%04x";
        }
      }
      else {
        uVar8 = (ulong)(uint)-iVar1;
        pcVar7 = " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n";
      }
    }
    else {
      iVar1 = mbedtls_entropy_add_source(&local_840,dev_random_entropy_poll,(void *)0x0,0x20,1);
      if (iVar1 == 0) {
        printf("\n    Using /dev/random, so can take a long time! ");
        fflush(_stdout);
        goto LAB_0010975e;
      }
      uVar8 = (ulong)(uint)-iVar1;
      pcVar7 = " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n";
    }
    printf(pcVar7,uVar8);
  }
LAB_001097e2:
  mbedtls_strerror(iVar1,local_438,0x400);
  printf(" - %s\n",local_438);
  iVar6 = 1;
LAB_0010980f:
  mbedtls_mpi_free(&local_9b0);
  mbedtls_mpi_free(&local_9c8);
  mbedtls_mpi_free(&local_9e0);
  mbedtls_mpi_free(&local_9f8);
  mbedtls_mpi_free(&local_a10);
  mbedtls_mpi_free(&local_a28);
  mbedtls_mpi_free(&local_a40);
  mbedtls_mpi_free(&local_a58);
  mbedtls_pk_free(&mStack_a68);
  mbedtls_ctr_drbg_free(&local_998);
  mbedtls_entropy_free(&local_840);
  return iVar6;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "gen_key";
#if defined(MBEDTLS_ECP_C)
    const mbedtls_ecp_curve_info *curve_info;
#endif

    /*
     * Set to sane values
     */

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_pk_init( &key );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
#if defined(MBEDTLS_ECP_C)
        mbedtls_printf( " available ec_curve values:\n" );
        curve_info = mbedtls_ecp_curve_list();
        mbedtls_printf( "    %s (default)\n", curve_info->name );
        while( ( ++curve_info )->name != NULL )
            mbedtls_printf( "    %s\n", curve_info->name );
#endif /* MBEDTLS_ECP_C */
        goto exit;
    }

    opt.type                = DFL_TYPE;
    opt.rsa_keysize         = DFL_RSA_KEYSIZE;
    opt.ec_curve            = DFL_EC_CURVE;
    opt.filename            = DFL_FILENAME;
    opt.format              = DFL_FORMAT;
    opt.use_dev_random      = DFL_USE_DEV_RANDOM;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "type" ) == 0 )
        {
            if( strcmp( q, "rsa" ) == 0 )
                opt.type = MBEDTLS_PK_RSA;
            else if( strcmp( q, "ec" ) == 0 )
                opt.type = MBEDTLS_PK_ECKEY;
            else
                goto usage;
        }
        else if( strcmp( p, "format" ) == 0 )
        {
            if( strcmp( q, "pem" ) == 0 )
                opt.format = FORMAT_PEM;
            else if( strcmp( q, "der" ) == 0 )
                opt.format = FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "rsa_keysize" ) == 0 )
        {
            opt.rsa_keysize = atoi( q );
            if( opt.rsa_keysize < 1024 ||
                opt.rsa_keysize > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
#if defined(MBEDTLS_ECP_C)
        else if( strcmp( p, "ec_curve" ) == 0 )
        {
            if( ( curve_info = mbedtls_ecp_curve_info_from_name( q ) ) == NULL )
                goto usage;
            opt.ec_curve = curve_info->grp_id;
        }
#endif
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "use_dev_random" ) == 0 )
        {
            opt.use_dev_random = atoi( q );
            if( opt.use_dev_random < 0 || opt.use_dev_random > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
#if !defined(_WIN32) && defined(MBEDTLS_FS_IO)
    if( opt.use_dev_random )
    {
        if( ( ret = mbedtls_entropy_add_source( &entropy, dev_random_entropy_poll,
                                        NULL, DEV_RANDOM_THRESHOLD,
                                        MBEDTLS_ENTROPY_SOURCE_STRONG ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n", -ret );
            goto exit;
        }

        mbedtls_printf("\n    Using /dev/random, so can take a long time! " );
        fflush( stdout );
    }
#endif /* !_WIN32 && MBEDTLS_FS_IO */

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * 1.1. Generate the key
     */
    mbedtls_printf( "\n  . Generating the private key ..." );
    fflush( stdout );

    if( ( ret = mbedtls_pk_setup( &key,
            mbedtls_pk_info_from_type( (mbedtls_pk_type_t) opt.type ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_pk_setup returned -0x%04x", -ret );
        goto exit;
    }

#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_GENPRIME)
    if( opt.type == MBEDTLS_PK_RSA )
    {
        ret = mbedtls_rsa_gen_key( mbedtls_pk_rsa( key ), mbedtls_ctr_drbg_random, &ctr_drbg,
                                   opt.rsa_keysize, 65537 );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( opt.type == MBEDTLS_PK_ECKEY )
    {
        ret = mbedtls_ecp_gen_key( (mbedtls_ecp_group_id) opt.ec_curve,
                                   mbedtls_pk_ec( key ),
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_ECP_C */
    {
        mbedtls_printf( " failed\n  !  key type not supported\n" );
        goto exit;
    }

    /*
     * 1.2 Print the key
     */
    mbedtls_printf( " ok\n  . Key information:\n" );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

        if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
            ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
        {
            mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
            goto exit;
        }

        mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
        mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
        mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
        mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
        mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
        mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
        mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
        mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
        mbedtls_printf( "curve: %s\n",
                mbedtls_ecp_curve_info_from_grp_id( ecp->grp.id )->name );
        mbedtls_mpi_write_file( "X_Q:   ", &ecp->Q.X, 16, NULL );
        mbedtls_mpi_write_file( "Y_Q:   ", &ecp->Q.Y, 16, NULL );
        mbedtls_mpi_write_file( "D:     ", &ecp->d  , 16, NULL );
    }
    else
#endif
        mbedtls_printf("  ! key type not supported\n");

    /*
     * 1.3 Export key
     */
    mbedtls_printf( "  . Writing key to file..." );

    if( ( ret = write_private_key( &key, opt.filename ) ) != 0 )
    {
        mbedtls_printf( " failed\n" );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}